

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

void appendChunk(ChunkEntry *ch,UA_ByteString *msg,size_t offset,size_t chunklength)

{
  size_t sVar1;
  UA_Byte *pUVar2;
  
  pUVar2 = (UA_Byte *)realloc((ch->bytes).data,(ch->bytes).length + chunklength);
  if (pUVar2 == (UA_Byte *)0x0) {
    deleteMembers_noInit(&ch->bytes,UA_TYPES + 0xe);
    (ch->bytes).length = 0;
    (ch->bytes).data = (UA_Byte *)0x0;
  }
  else {
    (ch->bytes).data = pUVar2;
    sVar1 = (ch->bytes).length;
    memcpy(pUVar2 + sVar1,msg->data + offset,chunklength);
    (ch->bytes).length = sVar1 + chunklength;
  }
  return;
}

Assistant:

static void
appendChunk(struct ChunkEntry *ch, const UA_ByteString *msg,
            size_t offset, size_t chunklength) {
    UA_Byte* new_bytes = UA_realloc(ch->bytes.data, ch->bytes.length + chunklength);
    if(!new_bytes) {
        UA_ByteString_deleteMembers(&ch->bytes);
        return;
    }
    ch->bytes.data = new_bytes;
    memcpy(&ch->bytes.data[ch->bytes.length], &msg->data[offset], chunklength);
    ch->bytes.length += chunklength;
}